

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseString(TidyDocImpl *doc,TidyOptionImpl *option)

{
  bool bVar1;
  tchar tVar2;
  Bool BVar3;
  TidyConfigImpl *config;
  bool bVar4;
  uint local_2038;
  tchar c;
  Bool waswhite;
  tchar delim;
  uint i;
  tmbchar buf [8192];
  TidyConfigImpl *cfg;
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  config = &doc->config;
  waswhite = no;
  c = 0;
  bVar1 = true;
  tVar2 = SkipWhite(config);
  if ((tVar2 == 0x22) || (local_2038 = tVar2, tVar2 == 0x27)) {
    local_2038 = AdvanceChar(config);
    c = tVar2;
  }
  do {
    while( true ) {
      bVar4 = false;
      if (((waswhite < 0x1ffe) && (bVar4 = false, local_2038 != 0xffffffff)) &&
         (bVar4 = false, local_2038 != 0xd)) {
        bVar4 = local_2038 != 10;
      }
      if ((!bVar4) || ((c != 0 && (local_2038 == c)))) {
        *(undefined1 *)((long)&delim + (ulong)waswhite) = 0;
        SetOptionValue(doc,option->id,(ctmbstr)&delim);
        return yes;
      }
      BVar3 = prvTidyIsWhite(local_2038);
      if (BVar3 != no) break;
      bVar1 = false;
LAB_001697e1:
      *(char *)((long)&delim + (ulong)waswhite) = (char)local_2038;
      local_2038 = AdvanceChar(config);
      waswhite = waswhite + yes;
    }
    if (!bVar1) {
      local_2038 = 0x20;
      goto LAB_001697e1;
    }
    local_2038 = AdvanceChar(config);
  } while( true );
}

Assistant:

Bool ParseString( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[8192];
    uint i = 0;
    tchar delim = 0;
    Bool waswhite = yes;

    tchar c = SkipWhite( cfg );

    if ( c == '"' || c == '\'' )
    {
        delim = c;
        c = AdvanceChar( cfg );
    }

    while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
    {
        if ( delim && c == delim )
            break;

        if ( TY_(IsWhite)(c) )
        {
            if ( waswhite )
            {
                c = AdvanceChar( cfg );
                continue;
            }
            c = ' ';
        }
        else
            waswhite = no;

        buf[i++] = (tmbchar) c;
        c = AdvanceChar( cfg );
    }
    buf[i] = '\0';

    SetOptionValue( doc, option->id, buf );
    return yes;
}